

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O2

Vec2<float> __thiscall
Imath_3_2::Frustum<float>::localToScreenExc(Frustum<float> *this,Vec2<float> *p)

{
  Vec2<float> VVar1;
  undefined1 auVar2 [16];
  domain_error *this_00;
  undefined8 *in_RDX;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  
  fVar6 = (float)*in_RDX;
  fVar7 = (float)((ulong)*in_RDX >> 0x20);
  fVar3 = (float)*(undefined8 *)&p[2].y;
  auVar5._0_4_ = (p[2].x - (fVar6 + fVar6)) + fVar3;
  fVar4 = (float)((ulong)*(undefined8 *)&p[2].y >> 0x20);
  auVar5._4_4_ = (p[3].y - (fVar7 + fVar7)) + fVar4;
  auVar5._8_4_ = (p[3].x - 0.0) + 0.0;
  auVar5._12_4_ = (p[3].y - 0.0) + 0.0;
  fVar3 = p[2].x - fVar3;
  fVar4 = p[3].y - fVar4;
  fVar6 = fVar3;
  if (fVar3 <= -fVar3) {
    fVar6 = -fVar3;
  }
  if (fVar6 < 1.0) {
    fVar7 = auVar5._0_4_;
    if (auVar5._0_4_ <= -auVar5._0_4_) {
      fVar7 = -auVar5._0_4_;
    }
    if (fVar6 * 3.4028235e+38 < fVar7) goto LAB_001293f1;
  }
  fVar6 = fVar4;
  if (fVar4 <= -fVar4) {
    fVar6 = -fVar4;
  }
  if (fVar6 < 1.0) {
    fVar7 = auVar5._4_4_;
    if (auVar5._4_4_ <= -auVar5._4_4_) {
      fVar7 = -auVar5._4_4_;
    }
    if (fVar6 * 3.4028235e+38 < fVar7) {
LAB_001293f1:
      this_00 = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error
                (this_00,"Bad viewing frustum: local-to-screen transformation cannot be computed");
      __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  auVar2._4_4_ = fVar4;
  auVar2._0_4_ = fVar3;
  auVar2._8_4_ = p[3].x - 0.0;
  auVar2._12_4_ = p[3].y - 0.0;
  auVar5 = divps(auVar5,auVar2);
  this->_vptr_Frustum = auVar5._0_8_;
  VVar1.y = fVar4;
  VVar1.x = fVar3;
  return VVar1;
}

Assistant:

IMATH_CONSTEXPR14 inline Vec2<T>
Frustum<T>::localToScreenExc (const Vec2<T>& p) const
{
    T leftPlusRight  = _left - T (2) * p.x + _right;
    T leftMinusRight = _left - _right;
    T bottomPlusTop  = _bottom - T (2) * p.y + _top;
    T bottomMinusTop = _bottom - _top;

    if ((abs (leftMinusRight) < T (1) &&
         abs (leftPlusRight) >
             std::numeric_limits<T>::max () * abs (leftMinusRight)) ||
        (abs (bottomMinusTop) < T (1) &&
         abs (bottomPlusTop) >
             std::numeric_limits<T>::max () * abs (bottomMinusTop)))
    {
        throw std::domain_error (
            "Bad viewing frustum: "
            "local-to-screen transformation cannot be computed");
    }

    return Vec2<T> (
        leftPlusRight / leftMinusRight, bottomPlusTop / bottomMinusTop);
}